

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalsList.h
# Opt level: O0

IntervalsList * __thiscall
dg::dda::IntervalsList::intersectWith(IntervalsList *this,IntervalsList *rhs)

{
  bool bVar1;
  pointer pIVar2;
  Offset *pOVar3;
  undefined8 in_RSI;
  IntervalsList *in_RDI;
  _Self tmp;
  Interval *RI;
  const_iterator __end2;
  const_iterator __begin2;
  list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
  *__range2;
  iterator it;
  Offset in_stack_ffffffffffffff90;
  const_iterator in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  _List_const_iterator<dg::dda::IntervalsList::Interval> local_50;
  iterator local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  _List_iterator<dg::dda::IntervalsList::Interval> local_20;
  undefined8 local_18;
  IntervalsList *local_8;
  
  local_18 = in_RSI;
  bVar1 = std::__cxx11::
          list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
          ::empty(&in_RDI->intervals);
  local_8 = in_RDI;
  if (!bVar1) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>::
         begin(&in_RDI->intervals);
    local_28 = local_18;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>::
         begin(&in_RDI->intervals);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>::
         end(&in_RDI->intervals);
    while (bVar1 = std::operator!=(&local_30,&local_38), local_8 = in_RDI, bVar1) {
      local_40 = std::_List_const_iterator<dg::dda::IntervalsList::Interval>::operator*
                           ((_List_const_iterator<dg::dda::IntervalsList::Interval> *)0x1924a8);
      while( true ) {
        pIVar2 = std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                           ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x1924b7);
        bVar1 = Offset::operator<(&pIVar2->end,&local_40->start);
        if (!bVar1) break;
        local_48._M_node =
             (_List_node_base *)
             std::_List_iterator<dg::dda::IntervalsList::Interval>::operator++(&local_20,0);
        std::_List_const_iterator<dg::dda::IntervalsList::Interval>::_List_const_iterator
                  (&local_50,&local_48);
        std::__cxx11::
        list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>::
        erase((list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
               *)in_stack_ffffffffffffff90.offset,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 =
             std::__cxx11::
             list<dg::dda::IntervalsList::Interval,_std::allocator<dg::dda::IntervalsList::Interval>_>
             ::end(&in_RDI->intervals);
        bVar1 = std::operator==(&local_20,(_Self *)&stack0xffffffffffffffa0);
        if (bVar1) {
          return in_RDI;
        }
      }
      std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x192541);
      bVar1 = Interval::overlaps((Interval *)in_stack_ffffffffffffffa0._M_node,
                                 (Interval *)in_stack_ffffffffffffff98._M_node);
      if (bVar1) {
        std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                  ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x19255e);
        pOVar3 = std::max<dg::Offset>((Offset *)in_RDI,(Offset *)0x19256b);
        in_stack_ffffffffffffff98._M_node = (_List_node_base *)pOVar3->offset;
        pIVar2 = std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                           ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x19257d);
        Offset::operator=(&pIVar2->start,(Offset)in_stack_ffffffffffffff98._M_node);
        std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                  ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x192594);
        pOVar3 = std::min<dg::Offset>((Offset *)in_RDI,(Offset *)0x1925a9);
        in_stack_ffffffffffffff90.offset = pOVar3->offset;
        pIVar2 = std::_List_iterator<dg::dda::IntervalsList::Interval>::operator->
                           ((_List_iterator<dg::dda::IntervalsList::Interval> *)0x1925bb);
        Offset::operator=(&pIVar2->end,in_stack_ffffffffffffff90);
      }
      std::_List_const_iterator<dg::dda::IntervalsList::Interval>::operator++(&local_30);
    }
  }
  return local_8;
}

Assistant:

IntervalsList &intersectWith(const IntervalsList &rhs) {
        if (intervals.empty())
            return *this;

        auto it = intervals.begin();
        for (const auto &RI : rhs.intervals) {
            while (it->end < RI.start) {
                auto tmp = it++;
                intervals.erase(tmp);
                if (it == intervals.end()) {
                    return *this;
                }
            }
            if (it->overlaps(RI)) {
                it->start = std::max(it->start, RI.start);
                it->end = std::min(it->end, RI.end);
            }
        }

        return *this;
    }